

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.cpp
# Opt level: O2

void switchStdOutIntoBinaryMode(void)

{
  return;
}

Assistant:

void switchStdOutIntoBinaryMode() {
#ifdef __CYGWIN__
	setmode(1, O_BINARY);
#elif _WIN32
	_setmode(1, _O_BINARY);
#else
	// nothing on systems with no text-vs-binary mode
#endif
}